

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::doAddCols(SPxLPBase<double> *this,LPColSetBase<double> *set,bool scale)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  Item *pIVar5;
  bool bVar6;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  Item *pIVar14;
  double dVar15;
  DataArray<int> newRows;
  LPRowBase<double> empty;
  DataArray<int> local_b8;
  long local_a0;
  LPColSetBase<double> *local_98;
  undefined8 uStack_90;
  DataKey local_80;
  double local_78;
  undefined8 uStack_70;
  LPRowBase<double> local_68;
  
  lVar9 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_b8.data = (int *)0x0;
  local_b8.memFactor = 1.2;
  local_b8.thesize = 0;
  if (0 < iVar1) {
    local_b8.thesize = iVar1;
  }
  local_b8.themax = 1;
  if (0 < iVar1) {
    local_b8.themax = local_b8.thesize;
  }
  spx_alloc<int*>(&local_b8.data,local_b8.themax);
  if (&this->super_LPColSetBase<double> != set) {
    LPColSetBase<double>::add(&this->super_LPColSetBase<double>,set);
  }
  iVar12 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar7 = (long)iVar12;
  local_a0 = lVar9;
  if (0 < lVar7) {
    memset(local_b8.data + ((lVar7 + -1) - (ulong)(iVar12 - 1)),0,lVar7 * 4);
  }
  lVar9 = (long)(set->super_SVSetBase<double>).set.thenum;
  if (0 < lVar9) {
    local_98 = set;
    do {
      pIVar14 = (local_98->super_SVSetBase<double>).set.theitem;
      iVar12 = (local_98->super_SVSetBase<double>).set.thekey[lVar9 + -1].idx;
      lVar7 = (long)pIVar14[iVar12].data.super_SVectorBase<double>.memused;
      if (0 < lVar7) {
        do {
          iVar2 = pIVar14[iVar12].data.super_SVectorBase<double>.m_elem[lVar7 + -1].idx;
          if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
            LPRowBase<double>::LPRowBase(&local_68,0);
            DataArray<int>::reSize(&local_b8,iVar2 + 1);
            iVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar13 = (long)iVar10;
            if (iVar10 <= iVar2) {
              iVar10 = (iVar2 - iVar10) + 1;
              do {
                local_b8.data[lVar13] = 0;
                local_80.info = 0;
                local_80.idx = -1;
                LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&local_80,&local_68);
                lVar13 = lVar13 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
            if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
              free(local_68.vec.theelem);
              local_68.vec.theelem = (Nonzero<double> *)0x0;
            }
          }
          local_b8.data[iVar2] = local_b8.data[iVar2] + 1;
          bVar6 = 1 < lVar7;
          lVar7 = lVar7 + -1;
        } while (bVar6);
      }
      bVar6 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar6);
  }
  lVar9 = local_a0;
  if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    lVar7 = 0;
    do {
      if (0 < local_b8.data[lVar7]) {
        pIVar14 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7].idx;
        iVar12 = local_b8.data[lVar7] + (pIVar14->data).super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend((SVSetBase<double> *)this,(SVectorBase<double> *)pIVar14,iVar12);
        (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
        [(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar7].idx].data.
        super_SVectorBase<double>.memused = iVar12;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  iVar12 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar7 = lVar9;
  if ((int)lVar9 < iVar12) {
    puVar8 = (ulong *)__tls_get_addr(&PTR_003b6b60);
    local_98 = (LPColSetBase<double> *)*puVar8;
    uStack_90 = 0;
    local_78 = -(double)local_98;
    uStack_70 = 0x8000000000000000;
    do {
      if (this->thesense != MAXIMIZE) {
        pdVar3 = (this->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3[lVar9] = -pdVar3[lVar9];
      }
      pIVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar9].idx;
      iVar12 = 0;
      if (scale) {
        iVar12 = (*this->lp_scaler->_vptr_SPxScaler[1])
                           (this->lp_scaler,pIVar14,&(this->super_LPRowSetBase<double>).scaleExp);
        dVar15 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
        ::soplex::infinity::__tls_init();
        if (dVar15 < (double)local_98) {
          dVar15 = ldexp((this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9],-iVar12);
          (this->super_LPColSetBase<double>).up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] = dVar15;
        }
        dVar15 = (this->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar9];
        ::soplex::infinity::__tls_init();
        if (local_78 < dVar15) {
          dVar15 = ldexp((this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9],-iVar12);
          (this->super_LPColSetBase<double>).low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] = dVar15;
        }
        dVar15 = ldexp((this->super_LPColSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9],iVar12);
        (this->super_LPColSetBase<double>).object.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar9] = dVar15;
        (this->super_LPColSetBase<double>).scaleExp.data[lVar9] = iVar12;
      }
      lVar7 = (long)(pIVar14->data).super_SVectorBase<double>.memused;
      if (0 < lVar7) {
        lVar13 = lVar7 + 1;
        lVar7 = lVar7 << 4;
        do {
          pNVar4 = (pIVar14->data).super_SVectorBase<double>.m_elem;
          iVar2 = *(int *)((long)pNVar4 + lVar7 + -8);
          pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          iVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx;
          lVar11 = (long)pIVar5[iVar10].data.super_SVectorBase<double>.memused -
                   (long)local_b8.data[iVar2];
          local_b8.data[iVar2] = local_b8.data[iVar2] + -1;
          pIVar5[iVar10].data.super_SVectorBase<double>.m_elem[lVar11].idx = (int)lVar9;
          if (scale) {
            dVar15 = ldexp(*(double *)((long)&pNVar4[-1].val + lVar7),
                           (this->super_LPRowSetBase<double>).scaleExp.data[iVar2] + iVar12);
            *(double *)((long)&(pIVar14->data).super_SVectorBase<double>.m_elem[-1].val + lVar7) =
                 dVar15;
          }
          pIVar5[iVar10].data.super_SVectorBase<double>.m_elem[lVar11].val =
               *(double *)((long)&(pIVar14->data).super_SVectorBase<double>.m_elem[-1].val + lVar7);
          lVar13 = lVar13 + -1;
          lVar7 = lVar7 + -0x10;
        } while (1 < lVar13);
      }
      lVar9 = lVar9 + 1;
      iVar12 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar7 = local_a0;
    } while (lVar9 < iVar12);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)(iVar12 - (int)lVar7));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar1));
  if (local_b8.data != (int *)0x0) {
    free(local_b8.data);
  }
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }